

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O3

UBool uhash_compareUChars_63(UHashTok key1,UHashTok key2)

{
  short sVar1;
  UChar *p1;
  short *psVar2;
  
  if (key1.pointer == key2.pointer) {
    return '\x01';
  }
  if (key2.pointer == (void *)0x0 || key1.pointer == (void *)0x0) {
    return '\0';
  }
  sVar1 = *key1.pointer;
  if (sVar1 != 0) {
    psVar2 = (short *)((long)key1.pointer + 2);
    do {
      if (sVar1 != *key2.pointer) goto LAB_002ace09;
      key2.pointer = key2.pointer + 2;
      sVar1 = *psVar2;
      psVar2 = psVar2 + 1;
    } while (sVar1 != 0);
  }
  sVar1 = 0;
LAB_002ace09:
  return sVar1 == *key2.pointer;
}

Assistant:

U_CAPI UBool U_EXPORT2
uhash_compareUChars(const UHashTok key1, const UHashTok key2) {
    const UChar *p1 = (const UChar*) key1.pointer;
    const UChar *p2 = (const UChar*) key2.pointer;
    if (p1 == p2) {
        return TRUE;
    }
    if (p1 == NULL || p2 == NULL) {
        return FALSE;
    }
    while (*p1 != 0 && *p1 == *p2) {
        ++p1;
        ++p2;
    }
    return (UBool)(*p1 == *p2);
}